

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaturalLogarithmExpression.cpp
# Opt level: O3

BaseExpressionPtr __thiscall
Kandinsky::NaturalLogarithmExpression::derivative
          (NaturalLogarithmExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<Kandinsky::BaseExpression> sVar2;
  BaseExpressionPtr BVar3;
  shared_ptr<Kandinsky::BaseExpression> local_60;
  Expression local_50;
  Expression local_38;
  int local_1c;
  
  local_1c = 1;
  operator/<int,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_50,&local_1c,
             (shared_ptr<Kandinsky::BaseExpression> *)
             &(variable->
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_60);
  operator*<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_38,&local_50,&local_60);
  sVar2 = BaseExpression::makePtr<Kandinsky::Expression>(&local_38);
  _Var1 = sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_38._vptr_Expression = (_func_int **)&PTR_variables_0011d508;
  if (local_38.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_60.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  local_50._vptr_Expression = (_func_int **)&PTR_variables_0011d508;
  if (local_50.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr NaturalLogarithmExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(1 / m_arg * m_arg->derivative(variable));
    }